

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O3

void google::protobuf::compiler::java::WriteDocCommentBody<google::protobuf::FieldDescriptor>
               (Printer *printer,FieldDescriptor *descriptor,Options *options,bool kdoc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  pointer pcVar4;
  Options options_00;
  bool bVar5;
  SourceLocation location;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined2 in_stack_ffffffffffffff1e;
  undefined1 *puVar8;
  undefined8 in_stack_ffffffffffffff28;
  long in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined1 *puVar9;
  undefined8 in_stack_ffffffffffffff48;
  long in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  SourceLocation local_98;
  
  paVar1 = &local_98.leading_comments.field_2;
  local_98.leading_comments._M_string_length = 0;
  local_98.leading_comments.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_98.trailing_comments.field_2;
  local_98.trailing_comments._M_string_length = 0;
  local_98.trailing_comments.field_2._M_local_buf[0] = '\0';
  local_98.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.leading_comments._M_dataplus._M_p = (pointer)paVar1;
  local_98.trailing_comments._M_dataplus._M_p = (pointer)paVar2;
  bVar5 = FieldDescriptor::GetSourceLocation(descriptor,&local_98);
  if (bVar5) {
    uVar7._0_1_ = options->opensource_runtime;
    uVar7._1_1_ = options->annotate_code;
    uVar6._0_1_ = options->generate_immutable_code;
    uVar6._1_1_ = options->generate_mutable_code;
    uVar6._2_1_ = options->generate_shared_code;
    uVar6._3_1_ = options->enforce_lite;
    puVar8 = &stack0xffffffffffffff30;
    pcVar4 = (options->annotation_list_file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff20,pcVar4,
               pcVar4 + (options->annotation_list_file)._M_string_length);
    pcVar4 = (options->output_list_file)._M_dataplus._M_p;
    puVar9 = &stack0xffffffffffffff50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff40,pcVar4,
               pcVar4 + (options->output_list_file)._M_string_length);
    uVar3._0_1_ = options->strip_nonfunctional_codegen;
    uVar3._1_1_ = options->jvm_dsl;
    uVar3._2_2_ = *(undefined2 *)&options->field_0x4a;
    options_00.opensource_runtime = (bool)(char)uVar7;
    options_00.annotate_code = (bool)(char)((ushort)uVar7 >> 8);
    options_00.generate_immutable_code = (bool)(char)uVar6;
    options_00.generate_mutable_code = (bool)(char)((uint)uVar6 >> 8);
    options_00.generate_shared_code = (bool)(char)((uint)uVar6 >> 0x10);
    options_00.enforce_lite = (bool)(char)((uint)uVar6 >> 0x18);
    options_00._6_2_ = in_stack_ffffffffffffff1e;
    options_00.annotation_list_file._M_dataplus._M_p = puVar8;
    options_00.annotation_list_file._M_string_length = in_stack_ffffffffffffff28;
    options_00.annotation_list_file.field_2._M_allocated_capacity = in_stack_ffffffffffffff30;
    options_00.annotation_list_file.field_2._8_8_ = in_stack_ffffffffffffff38;
    options_00.output_list_file._M_dataplus._M_p = puVar9;
    options_00.output_list_file._M_string_length = in_stack_ffffffffffffff48;
    options_00.output_list_file.field_2._M_allocated_capacity = in_stack_ffffffffffffff50;
    options_00.output_list_file.field_2._8_8_ = in_stack_ffffffffffffff58;
    options_00.strip_nonfunctional_codegen = (bool)(char)(short)uVar3;
    options_00.jvm_dsl = (bool)(char)((ushort)(short)uVar3 >> 8);
    options_00._74_6_ = in_stack_ffffffffffffff62;
    WriteDocCommentBodyForLocation(printer,&local_98,options_00,(bool)(undefined1)uVar3);
    if (puVar9 != &stack0xffffffffffffff50) {
      operator_delete(puVar9,in_stack_ffffffffffffff50 + 1);
    }
    if (puVar8 != &stack0xffffffffffffff30) {
      operator_delete(puVar8,in_stack_ffffffffffffff30 + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.trailing_comments._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.trailing_comments._M_dataplus._M_p,
                    CONCAT71(local_98.trailing_comments.field_2._M_allocated_capacity._1_7_,
                             local_98.trailing_comments.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.leading_comments._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.leading_comments._M_dataplus._M_p,
                    CONCAT71(local_98.leading_comments.field_2._M_allocated_capacity._1_7_,
                             local_98.leading_comments.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void WriteDocCommentBody(io::Printer* printer,
                                const DescriptorType* descriptor,
                                const Options options, const bool kdoc) {
  SourceLocation location;
  if (descriptor->GetSourceLocation(&location)) {
    WriteDocCommentBodyForLocation(printer, location, options, kdoc);
  }
}